

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinproc.c
# Opt level: O3

void nn_sinproc_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  int *self_00;
  undefined1 *puVar1;
  int iVar2;
  int iVar3;
  int extraout_EDX;
  int extraout_EDX_00;
  nn_fsm_event *event;
  nn_fsm *pnVar4;
  
  pnVar4 = self + 1;
  switch(*(undefined4 *)&self[1].fn) {
  case 1:
    if (src != -2) goto LAB_0012b241;
    if (type == -2) {
      *(undefined4 *)&pnVar4->fn = 2;
      return;
    }
    goto LAB_0012b249;
  case 2:
    if (src != 0x6c41) {
      if (src != -2) goto LAB_0012b25b;
      if (type == 1) {
        *(undefined4 *)&pnVar4->fn = 3;
        return;
      }
      goto LAB_0012b26d;
    }
    if (type == 2) {
      self[1].shutdown_fn = (nn_fsm_fn)srcptr;
      iVar2 = nn_pipebase_start((nn_pipebase *)&self[1].state);
      if (iVar2 == 0) {
        *(undefined4 *)&self[1].fn = 4;
        pnVar4 = (nn_fsm *)self[1].shutdown_fn;
        event = (nn_fsm_event *)&self[5].ctx;
        iVar2 = 3;
        goto LAB_0012b204;
      }
      nn_sinproc_handler_cold_11();
LAB_0012b21d:
      nn_sinproc_handler_cold_4();
      goto LAB_0012b222;
    }
    goto LAB_0012b277;
  case 3:
switchD_0012afd7_caseD_3:
    if (src != 0x6c41) goto LAB_0012b231;
    if (type == 3) {
      iVar2 = nn_pipebase_start((nn_pipebase *)&self[1].state);
      if (iVar2 == 0) {
LAB_0012b146:
        *(undefined4 *)&pnVar4->fn = 4;
        return;
      }
      nn_pipebase_stop((nn_pipebase *)&self[1].state);
      *(undefined4 *)&self[1].fn = 5;
      self[1].shutdown_fn = (nn_fsm_fn)0x0;
      pnVar4 = self + 6;
      goto LAB_0012b1b6;
    }
    if (type == 2) {
      self = (nn_fsm *)&self[1].state;
      iVar2 = nn_pipebase_start((nn_pipebase *)self);
      if (iVar2 == 0) goto LAB_0012b146;
      nn_sinproc_handler_cold_8();
      type = extraout_EDX_00;
      goto switchD_0012afd7_caseD_4;
    }
    goto LAB_0012b263;
  case 4:
switchD_0012afd7_caseD_4:
    if (src == 0x6c41) {
      if (type == 6) {
        nn_pipebase_stop((nn_pipebase *)&self[1].state);
        nn_fsm_raiseto(self,(nn_fsm *)self[1].shutdown_fn,
                       (nn_fsm_event *)&((nn_fsm *)self[1].shutdown_fn)[6].stopped.type,0x6c41,6,
                       self);
        *(undefined4 *)&self[1].fn = 5;
        self[1].shutdown_fn = (nn_fsm_fn)0x0;
        pnVar4 = self + 6;
LAB_0012b1b6:
        nn_fsm_raise(self,(nn_fsm_event *)&(pnVar4->stopped).type,6);
        return;
      }
      if (type == 5) {
        if (((ulong)self[1].fn & 0x100000000) != 0) {
          nn_pipebase_sent((nn_pipebase *)&self[1].state);
          puVar1 = (undefined1 *)((long)&self[1].fn + 4);
          *puVar1 = *puVar1 & 0xfe;
          return;
        }
        goto LAB_0012b21d;
      }
      if (type != 4) goto LAB_0012b281;
      self_00 = &self[3].stopped.src;
      iVar2 = nn_msgqueue_empty((nn_msgqueue *)self_00);
      iVar3 = nn_msgqueue_send((nn_msgqueue *)self_00,(nn_msg *)(self[1].shutdown_fn + 0x180));
      if (iVar3 == -0xb) {
        puVar1 = (undefined1 *)((long)&self[1].fn + 4);
        *puVar1 = *puVar1 | 2;
        return;
      }
      if (iVar3 == 0) {
        nn_msg_init((nn_msg *)(self[1].shutdown_fn + 0x180),0);
        if (iVar2 != 0) {
          nn_pipebase_received((nn_pipebase *)&self[1].state);
        }
        pnVar4 = (nn_fsm *)self[1].shutdown_fn;
        event = (nn_fsm_event *)&pnVar4[6].owner;
        iVar2 = 5;
LAB_0012b204:
        nn_fsm_raiseto(self,pnVar4,event,0x6c41,iVar2,self);
        return;
      }
LAB_0012b222:
      nn_sinproc_handler_cold_5();
      goto LAB_0012b229;
    }
    break;
  case 5:
    if (src == 0x6c41) {
      if (type == 5) {
        return;
      }
      src = type;
      nn_sinproc_handler_cold_2();
      type = extraout_EDX;
      goto switchD_0012afd7_caseD_3;
    }
LAB_0012b229:
    nn_sinproc_handler_cold_1();
LAB_0012b231:
    nn_sinproc_handler_cold_7();
    break;
  default:
    goto switchD_0012afd7_default;
  }
  nn_sinproc_handler_cold_3();
LAB_0012b241:
  nn_sinproc_handler_cold_14();
LAB_0012b249:
  nn_sinproc_handler_cold_15();
switchD_0012afd7_default:
  nn_sinproc_handler_cold_16();
LAB_0012b25b:
  nn_sinproc_handler_cold_13();
LAB_0012b263:
  nn_sinproc_handler_cold_9();
LAB_0012b26d:
  nn_sinproc_handler_cold_12();
LAB_0012b277:
  nn_sinproc_handler_cold_10();
LAB_0012b281:
  nn_sinproc_handler_cold_6();
}

Assistant:

static void nn_sinproc_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    int rc;
    struct nn_sinproc *sinproc;
    int empty;

    sinproc = nn_cont (self, struct nn_sinproc, fsm);

    switch (sinproc->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_SINPROC_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                sinproc->state = NN_SINPROC_STATE_CONNECTING;
                return;
            default:
                nn_fsm_bad_action (sinproc->state, src, type);
            }

        default:
            nn_fsm_bad_source (sinproc->state, src, type);
        }

/******************************************************************************/
/*  CONNECTING state.                                                         */
/*  CONNECT request was sent to the peer. Now we are waiting for the          */
/*  acknowledgement.                                                          */
/******************************************************************************/
    case NN_SINPROC_STATE_CONNECTING:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_SINPROC_ACTION_READY:
                sinproc->state = NN_SINPROC_STATE_READY;
                return;
            default:
                nn_fsm_bad_action (sinproc->state, src, type);
            }

        case NN_SINPROC_SRC_PEER:
            switch (type) {
            case NN_SINPROC_READY:
                sinproc->peer = (struct nn_sinproc*) srcptr;
                rc = nn_pipebase_start (&sinproc->pipebase);
                errnum_assert (rc == 0, -rc);
                sinproc->state = NN_SINPROC_STATE_ACTIVE;
                nn_fsm_raiseto (&sinproc->fsm, &sinproc->peer->fsm,
                    &sinproc->event_connect,
                    NN_SINPROC_SRC_PEER, NN_SINPROC_ACCEPTED, self);
                return;
            default:
                nn_fsm_bad_action (sinproc->state, src, type);
            }

        default:
            nn_fsm_bad_source (sinproc->state, src, type);
        }

/******************************************************************************/
/*  READY state.                                                              */
/*                                                                            */
/******************************************************************************/
    case NN_SINPROC_STATE_READY:
        switch (src) {

        case NN_SINPROC_SRC_PEER:
            switch (type) {
            case NN_SINPROC_READY:
                /*  This means both peers sent READY so they are both
                    ready for receiving messages  */
                rc = nn_pipebase_start (&sinproc->pipebase);
                errnum_assert (rc == 0, -rc);
                sinproc->state = NN_SINPROC_STATE_ACTIVE;
                return;
            case NN_SINPROC_ACCEPTED:
                rc = nn_pipebase_start (&sinproc->pipebase);
		/*  We can fail this due to excl_add saying we are already
                    connected. */
                if (rc != 0) {
                    nn_pipebase_stop (&sinproc->pipebase);
                    sinproc->state = NN_SINPROC_STATE_DISCONNECTED;
                    sinproc->peer = NULL;
                    nn_fsm_raise (&sinproc->fsm, &sinproc->event_disconnect,
                        NN_SINPROC_DISCONNECT);
                    return;
                }
                errnum_assert (rc == 0, -rc);
                sinproc->state = NN_SINPROC_STATE_ACTIVE;
                return;
            default:
                nn_fsm_bad_action (sinproc->state, src, type);
            }

        default:
            nn_fsm_bad_source (sinproc->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_SINPROC_STATE_ACTIVE:
        switch (src) {

        case NN_SINPROC_SRC_PEER:
            switch (type) {
            case NN_SINPROC_SENT:

                empty = nn_msgqueue_empty (&sinproc->msgqueue);

                /*  Push the message to the inbound message queue. */
                rc = nn_msgqueue_send (&sinproc->msgqueue,
                    &sinproc->peer->msg);
                if (rc == -EAGAIN) {
                    sinproc->flags |= NN_SINPROC_FLAG_RECEIVING;
                    return;
                }
                errnum_assert (rc == 0, -rc);
                nn_msg_init (&sinproc->peer->msg, 0);

                /*  Notify the user that there's a message to receive. */
                if (empty)
                    nn_pipebase_received (&sinproc->pipebase);

                /*  Notify the peer that the message was received. */
                nn_fsm_raiseto (&sinproc->fsm, &sinproc->peer->fsm,
                    &sinproc->peer->event_received, NN_SINPROC_SRC_PEER,
                    NN_SINPROC_RECEIVED, sinproc);

                return;

            case NN_SINPROC_RECEIVED:
                nn_assert (sinproc->flags & NN_SINPROC_FLAG_SENDING);
                nn_pipebase_sent (&sinproc->pipebase);
                sinproc->flags &= ~NN_SINPROC_FLAG_SENDING;
                return;

            case NN_SINPROC_DISCONNECT:
                nn_pipebase_stop (&sinproc->pipebase);
                nn_fsm_raiseto (&sinproc->fsm, &sinproc->peer->fsm,
                    &sinproc->peer->event_disconnect, NN_SINPROC_SRC_PEER,
                    NN_SINPROC_DISCONNECT, sinproc);
                sinproc->state = NN_SINPROC_STATE_DISCONNECTED;
                sinproc->peer = NULL;
                nn_fsm_raise (&sinproc->fsm, &sinproc->event_disconnect,
                    NN_SINPROC_DISCONNECT);
                return;

            default:
                nn_fsm_bad_action (sinproc->state, src, type);
            }

        default:
            nn_fsm_bad_source (sinproc->state, src, type);
        }

/******************************************************************************/
/*  DISCONNECTED state.                                                       */
/*  The peer have already closed the connection, but the object was not yet   */
/*  asked to stop.                                                            */
/******************************************************************************/
    case NN_SINPROC_STATE_DISCONNECTED:
        switch (src) {
        case NN_SINPROC_SRC_PEER:
            switch (type) {
            case NN_SINPROC_RECEIVED:
                /*  This case can safely be ignored. It may happen when
                    nn_close() comes before the already enqueued
                    NN_SINPROC_RECEIVED has been delivered.  */
                return;
            default:
                nn_fsm_bad_action (sinproc->state, src, type);
            };
        default:
            nn_fsm_bad_source (sinproc->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (sinproc->state, src, type);
    }
}